

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamFtp::~BamFtp(BamFtp *this)

{
  TcpSocket *pTVar1;
  pointer pcVar2;
  
  (this->super_IBamIODevice)._vptr_IBamIODevice = (_func_int **)&PTR__BamFtp_0016b950;
  Close(this);
  pTVar1 = this->m_commandSocket;
  if (pTVar1 != (TcpSocket *)0x0) {
    TcpSocket::~TcpSocket(pTVar1);
    operator_delete(pTVar1);
  }
  pTVar1 = this->m_dataSocket;
  if (pTVar1 != (TcpSocket *)0x0) {
    TcpSocket::~TcpSocket(pTVar1);
    operator_delete(pTVar1);
  }
  pcVar2 = (this->m_response)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_response).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_password)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_password).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_username)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_username).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_filename).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_dataHostname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_dataHostname).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_hostname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_hostname).field_2) {
    operator_delete(pcVar2);
  }
  (this->super_IBamIODevice)._vptr_IBamIODevice = (_func_int **)&PTR__IBamIODevice_0016b9d8;
  pcVar2 = (this->super_IBamIODevice).m_errorString._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_IBamIODevice).m_errorString.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

BamFtp::~BamFtp(void) {

    // close connection & clean up
    Close();
    if ( m_commandSocket )
        delete m_commandSocket;
    if ( m_dataSocket )
        delete m_dataSocket;
}